

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O2

Var Js::JavascriptExternalFunction::TTDReplayDummyExternalMethod
              (Var callee,Var *args,USHORT cargs,StdCallJavascriptMethodInfo *info,
              void *callbackState)

{
  EventLog *this;
  bool bVar1;
  ScriptContext *pSVar2;
  
  pSVar2 = Js::Type::GetScriptContext(*(Type **)((long)callee + 8));
  this = pSVar2->threadContext->TTDLog;
  if (this == (EventLog *)0x0) {
    TTDAbort_unrecoverable_error("How did this get created then???");
  }
  bVar1 = TTD::EventLog::IsDebugModeFlagSet(this);
  if (bVar1) {
    return (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           undefinedValue.ptr;
  }
  TTDAbort_unrecoverable_error("This should never be reached in pure replay mode!!!");
}

Assistant:

Var __stdcall JavascriptExternalFunction::TTDReplayDummyExternalMethod(Var callee, Var *args, USHORT cargs, StdCallJavascriptMethodInfo *info, void *callbackState)
    {
        JavascriptExternalFunction* externalFunction = static_cast<JavascriptExternalFunction*>(callee);

        ScriptContext* scriptContext = externalFunction->type->GetScriptContext();
        TTD::EventLog* elog = scriptContext->GetThreadContext()->TTDLog;
        TTDAssert(elog != nullptr, "How did this get created then???");

        //If this flag is set then this is ok (the debugger may be evaluating this so just return undef -- otherwise this is an error
        if(!elog->IsDebugModeFlagSet())
        {
            TTDAssert(false, "This should never be reached in pure replay mode!!!");
            return nullptr;
        }

        return scriptContext->GetLibrary()->GetUndefined();
    }